

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O2

App * __thiscall
CLI::App::add_subcommand(App *this,string *subcommand_name,string *subcommand_description)

{
  bool bVar1;
  App *pAVar2;
  IncorrectConstruction *this_00;
  App_p subcom;
  App_p local_98;
  string local_88;
  string local_68;
  string local_48;
  
  if (subcommand_name->_M_string_length != 0) {
    bVar1 = detail::valid_name_string(subcommand_name);
    if (!bVar1) {
      this_00 = (IncorrectConstruction *)__cxa_allocate_exception(0x38);
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_48,"subcommand name is not valid",(allocator<char> *)&subcom);
      IncorrectConstruction::IncorrectConstruction(this_00,&local_48);
      __cxa_throw(this_00,&IncorrectConstruction::typeinfo,Error::~Error);
    }
  }
  pAVar2 = (App *)operator_new(800);
  ::std::__cxx11::string::string((string *)&local_68,(string *)subcommand_description);
  ::std::__cxx11::string::string((string *)&local_88,(string *)subcommand_name);
  App(pAVar2,&local_68,&local_88,this);
  ::std::__shared_ptr<CLI::App,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<CLI::App,void>
            ((__shared_ptr<CLI::App,(__gnu_cxx::_Lock_policy)2> *)&subcom,pAVar2);
  ::std::__cxx11::string::~string((string *)&local_88);
  ::std::__cxx11::string::~string((string *)&local_68);
  local_98.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       subcom.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_98.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       subcom.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  subcom.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  subcom.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pAVar2 = add_subcommand(this,&local_98);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_98.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&subcom.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return pAVar2;
}

Assistant:

App *add_subcommand(std::string subcommand_name = "", std::string subcommand_description = "") {
        if(!subcommand_name.empty() && !detail::valid_name_string(subcommand_name)) {
            throw IncorrectConstruction("subcommand name is not valid");
        }
        CLI::App_p subcom = std::shared_ptr<App>(new App(std::move(subcommand_description), subcommand_name, this));
        return add_subcommand(std::move(subcom));
    }